

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  ulong uVar1;
  long lVar2;
  GCtrace *T;
  TValue *f;
  void *cf_1;
  void *cf;
  BCPos pos;
  GCproto *pt;
  BCIns *ins;
  cTValue *nextframe_local;
  GCfunc *fn_local;
  lua_State *L_local;
  
  if ((fn->c).ffid == '\0') {
    if (nextframe == (cTValue *)0x0) {
      uVar1 = (ulong)L->cframe & 0xfffffffffffffffc;
      if ((uVar1 == 0) || (*(long *)(uVar1 + 0x18) == *(long *)(uVar1 + 0x10))) {
        return 0xffffffff;
      }
      pt = *(GCproto **)(uVar1 + 0x18);
    }
    else if ((nextframe->u64 & 3) == 0) {
      pt = *(GCproto **)nextframe;
    }
    else if ((nextframe->u64 & 7) == 2) {
      pt = *(GCproto **)(nextframe + -2);
    }
    else {
      f = (TValue *)((ulong)L->cframe & 0xfffffffffffffffc);
      T = (GCtrace *)(L->base + -1);
      while( true ) {
        if (f == (TValue *)0x0) {
          return 0xffffffff;
        }
        while ((f[1].field_4.i < 0 && (T < (GCtrace *)((L->stack).ptr64 + (long)-f[1].field_4.i))))
        {
          f = (TValue *)(f[4].u64 & 0xfffffffffffffffc);
          if (f == (TValue *)0x0) {
            return 0xffffffff;
          }
        }
        if (T < nextframe) break;
        if (((T->nextgc).gcptr64 & 3) == 0) {
          lVar2 = (ulong)((*(uint *)((T->nextgc).gcptr64 - 4) >> 8 & 0xff) + 2) * -8;
        }
        else {
          if ((((T->nextgc).gcptr64 & 3) == 1) ||
             ((((T->nextgc).gcptr64 & 7) == 2 &&
              (lVar2._0_4_ = T[-1].mcloop, lVar2._4_2_ = T[-1].nchild, lVar2._6_2_ = T[-1].spadjust,
              lVar2 == 1)))) {
            f = (TValue *)(f[4].u64 & 0xfffffffffffffffc);
          }
          lVar2 = -((T->nextgc).gcptr64 & 0xfffffffffffffff8);
        }
        T = (GCtrace *)((long)&(T->nextgc).gcptr64 + lVar2);
      }
      pt = (GCproto *)f[3].u64;
      if (pt == (GCproto *)0x0) {
        return 0xffffffff;
      }
    }
    lVar2 = *(long *)((long)fn + 0x20);
    cf._4_4_ = (int)((long)pt - lVar2 >> 2) - 1;
    if (*(uint *)(lVar2 + -0x5c) < cf._4_4_) {
      cf._4_4_ = (uint)(*(long *)((long)&pt[-1].uvinfo.ptr64 + 4) - lVar2 >> 2);
    }
    L_local._4_4_ = cf._4_4_;
  }
  else {
    L_local._4_4_ = 0xffffffff;
  }
  return L_local._4_4_;
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
    lj_assertL(bc_isret(bc_op(ins[-1])), "return bytecode expected");
    pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
  }
#endif
  return pos;
}